

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtree.c
# Opt level: O2

void print_tree_comp(FILE *fp,char *label,dtree_node_t *node,pset_t *pset,uint32 lvl)

{
  char cVar1;
  
  fputs(label,(FILE *)fp);
  for (cVar1 = '\0'; (uint)(int)cVar1 < lvl * 4; cVar1 = cVar1 + '\x01') {
    putc(0x20,(FILE *)fp);
  }
  fwrite("( ",2,1,(FILE *)fp);
  print_node_comp(fp,node,pset);
  if ((node->y != (dtree_node_str *)0x0) && (node->n != (dtree_node_str *)0x0)) {
    fputc(10,(FILE *)fp);
    print_tree_comp(fp,label,node->y,pset,lvl + 1);
    fputc(10,(FILE *)fp);
    print_tree_comp(fp,label,node->n,pset,lvl + 1);
  }
  fputc(0x29,(FILE *)fp);
  return;
}

Assistant:

void
print_tree_comp(FILE *fp,
		char *label,
		dtree_node_t *node,
		pset_t *pset,
		uint32 lvl)
{
    char i;

    fprintf(fp, "%s", label);
    for (i = 0; i < lvl*4; i++) {
	putc(' ', fp);
    }

    fprintf(fp, "( ");

    print_node_comp(fp, node, pset);

    if (node->y && node->n) {
	fprintf(fp, "\n");
	print_tree_comp(fp, label, node->y, pset, lvl+1);

	fprintf(fp, "\n");
	print_tree_comp(fp, label, node->n, pset, lvl+1);
    }

    fprintf(fp, ")");
}